

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O0

qint64 __thiscall
QHttpNetworkReplyPrivate::getChunkSize
          (QHttpNetworkReplyPrivate *this,QIODevice *socket,qint64 *chunkSize)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  qsizetype qVar5;
  long lVar6;
  long *in_RDX;
  long *in_RSI;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  qint64 haveRead;
  int fragmentSize;
  qint64 sniffedBytes;
  int bytesAvailable;
  qint64 bytes;
  char c;
  QByteArrayView fragmentView;
  bool ok;
  char crlf [2];
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  QByteArray *in_stack_ffffffffffffff60;
  QByteArrayView *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff88;
  long local_70;
  long local_50;
  undefined1 local_41 [17];
  QByteArrayView local_30;
  QByteArrayView local_20;
  undefined1 local_b;
  undefined2 local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_70 = 0;
  local_a = 0xaaaa;
  *in_RDX = -1;
  iVar2 = (**(code **)(*in_RSI + 0xa0))();
  do {
    if (iVar2 <= local_70) {
LAB_00306990:
      local_50 = local_70;
LAB_0030699a:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_50;
    }
    lVar4 = QIODevice::peek((char *)in_RSI,(longlong)&local_a);
    qVar5 = QByteArray::size((QByteArray *)(in_RDI + 0x12));
    iVar3 = (int)qVar5;
    if (((((iVar3 != 0) && (lVar4 == 2)) && ((char)local_a == '\r')) && (local_a._1_1_ == '\n')) ||
       (((1 < iVar3 &&
         (bVar1 = QByteArray::endsWith
                            (in_stack_ffffffffffffff60,
                             (char)((uint)in_stack_ffffffffffffff5c >> 0x18)), bVar1)) &&
        ((char)local_a == '\n')))) {
      lVar6 = QIODevice::read((char *)in_RSI,(longlong)&local_a);
      local_70 = lVar6 + local_70;
      if ((char)local_a == '\r') {
        lVar6 = QIODevice::read((char *)in_RSI,(longlong)&local_a);
        local_70 = lVar6 + local_70;
      }
      local_b = 0;
      local_20.m_data = (storage_type *)0xaaaaaaaaaaaaaaaa;
      local_20.m_size = 0xaaaaaaaaaaaaaaaa;
      QByteArrayView::QByteArrayView<QByteArray,_true>
                (in_stack_ffffffffffffff70,(QByteArray *)in_RDI);
      QByteArray::indexOf((QByteArray *)in_RDI,(char)((ulong)in_stack_ffffffffffffff60 >> 0x38),
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
      local_30 = QByteArrayView::mid((QByteArrayView *)CONCAT44(iVar3,in_stack_ffffffffffffff78),
                                     CONCAT44(iVar2,in_stack_ffffffffffffff88),lVar4);
      local_20 = QByteArrayView::trimmed(in_RDI);
      lVar4 = QByteArrayView::toLong
                        (in_RDI,(bool *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
      *in_RDX = lVar4;
      QByteArray::clear();
      goto LAB_00306990;
    }
    local_41[0] = 0;
    in_stack_ffffffffffffff70 = (QByteArrayView *)QIODevice::read((char *)in_RSI,(longlong)local_41)
    ;
    if ((long)in_stack_ffffffffffffff70 < 0) {
      local_50 = -1;
      goto LAB_0030699a;
    }
    local_70 = (long)&in_stack_ffffffffffffff70->m_size + local_70;
    QByteArray::append((char)in_RDI + ' ');
  } while( true );
}

Assistant:

qint64 QHttpNetworkReplyPrivate::getChunkSize(QIODevice *socket, qint64 *chunkSize)
{
    qint64 bytes = 0;
    char crlf[2];
    *chunkSize = -1;

    int bytesAvailable = socket->bytesAvailable();
    // FIXME rewrite to permanent loop without bytesAvailable
    while (bytesAvailable > bytes) {
        qint64 sniffedBytes = socket->peek(crlf, 2);
        int fragmentSize = fragment.size();

        // check the next two bytes for a "\r\n", skip blank lines
        if ((fragmentSize && sniffedBytes == 2 && crlf[0] == '\r' && crlf[1] == '\n')
           ||(fragmentSize > 1 && fragment.endsWith('\r')  && crlf[0] == '\n'))
        {
            bytes += socket->read(crlf, 1);     // read the \r or \n
            if (crlf[0] == '\r')
                bytes += socket->read(crlf, 1); // read the \n
            bool ok = false;
            // ignore the chunk-extension
            const auto fragmentView = QByteArrayView(fragment).mid(0, fragment.indexOf(';')).trimmed();
            *chunkSize = fragmentView.toLong(&ok, 16);
            fragment.clear();
            break; // size done
        } else {
            // read the fragment to the buffer
            char c = 0;
            qint64 haveRead = socket->read(&c, 1);
            if (haveRead < 0) {
                return -1; // FIXME
            }
            bytes += haveRead;
            fragment.append(c);
        }
    }

    return bytes;
}